

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O1

bool __thiscall GCSFilter::MatchInternal(GCSFilter *this,uint64_t *element_hashes,size_t size)

{
  size_t sVar1;
  uint64_t uVar2;
  ulong uVar3;
  bool bVar4;
  size_t sVar5;
  uint uVar6;
  long in_FS_OFFSET;
  BitStreamReader<SpanReader> bitreader;
  SpanReader stream;
  undefined4 local_5c;
  BitStreamReader<SpanReader> local_58;
  SpanReader local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_data.m_data =
       (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.m_data.m_size =
       (long)(this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)local_48.m_data.m_data;
  uVar2 = ReadCompactSize<SpanReader>(&local_48,true);
  if (uVar2 != this->m_N) {
    __assert_fail("N == m_N",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockfilter.cpp"
                  ,0x6d,"bool GCSFilter::MatchInternal(const uint64_t *, size_t) const");
  }
  local_58.m_buffer = '\0';
  local_58.m_offset = 8;
  uVar6 = 0;
  local_58.m_istream = &local_48;
  if (this->m_N != 0) {
    local_5c = (undefined4)uVar2;
    sVar5 = 0;
    uVar3 = 0;
    do {
      uVar2 = GolombRiceDecode<SpanReader>(&local_58,(this->m_params).m_P);
      uVar3 = uVar2 + uVar3;
      sVar1 = sVar5;
      for (; sVar5 != size; sVar5 = sVar5 + 1) {
        if (element_hashes[sVar5] == uVar3) {
          local_5c = 1;
          bVar4 = false;
          goto LAB_00871d13;
        }
        if (uVar3 < element_hashes[sVar5]) {
          bVar4 = true;
          goto LAB_00871d13;
        }
        sVar1 = size;
      }
      bVar4 = false;
      local_5c = 0;
      sVar5 = sVar1;
LAB_00871d13:
      if (!bVar4) goto LAB_00871d28;
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->m_N);
  }
  local_5c._0_1_ = 0;
LAB_00871d28:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)((byte)local_5c & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool GCSFilter::MatchInternal(const uint64_t* element_hashes, size_t size) const
{
    SpanReader stream{m_encoded};

    // Seek forward by size of N
    uint64_t N = ReadCompactSize(stream);
    assert(N == m_N);

    BitStreamReader bitreader{stream};

    uint64_t value = 0;
    size_t hashes_index = 0;
    for (uint32_t i = 0; i < m_N; ++i) {
        uint64_t delta = GolombRiceDecode(bitreader, m_params.m_P);
        value += delta;

        while (true) {
            if (hashes_index == size) {
                return false;
            } else if (element_hashes[hashes_index] == value) {
                return true;
            } else if (element_hashes[hashes_index] > value) {
                break;
            }

            hashes_index++;
        }
    }

    return false;
}